

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result wabt::ResolveNamesScript(Script *script,Errors *errors)

{
  pointer puVar1;
  Command *base;
  ModuleCommand *pMVar2;
  AssertModuleCommand<(wabt::CommandType)4> *pAVar3;
  AssertModuleCommand<(wabt::CommandType)5> *pAVar4;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *command;
  pointer puVar5;
  Errors errors_1;
  NameResolver resolver;
  Errors local_178;
  NameResolver local_160;
  NameResolver local_c8;
  
  anon_unknown_16::NameResolver::NameResolver(&local_160,script,errors);
  puVar5 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar1) {
      anon_unknown_16::NameResolver::~NameResolver(&local_160);
      return (Result)local_160.result_.enum_;
    }
    base = (puVar5->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
           _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
           super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    switch(base->type) {
    case First:
      pMVar2 = cast<wabt::ModuleCommand,wabt::Command>(base);
      anon_unknown_16::NameResolver::VisitModule(&local_160,&pMVar2->module);
      break;
    case AssertInvalid:
      pAVar3 = cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>(base);
      local_178.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      anon_unknown_16::NameResolver::NameResolver(&local_c8,local_160.script_,&local_178);
      anon_unknown_16::NameResolver::VisitScriptModule
                (&local_c8,
                 (pAVar3->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
      anon_unknown_16::NameResolver::~NameResolver(&local_c8);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_178);
      break;
    case AssertUnlinkable:
      pAVar4 = cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>(base);
      goto LAB_001840d3;
    case AssertUninstantiable:
      pAVar4 = (AssertModuleCommand<(wabt::CommandType)5> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>(base);
LAB_001840d3:
      anon_unknown_16::NameResolver::VisitScriptModule
                (&local_160,
                 (pAVar4->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

Result ResolveNamesScript(Script* script, Errors* errors) {
  NameResolver resolver(script, errors);
  return resolver.VisitScript(script);
}